

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPublicKey.cpp
# Opt level: O2

void __thiscall OSSLRSAPublicKey::createOSSLKey(OSSLRSAPublicKey *this)

{
  RSA *rsa;
  RSA_METHOD *meth;
  BIGNUM *pBVar1;
  BIGNUM *pBVar2;
  
  if (this->rsa != (RSA *)0x0) {
    return;
  }
  rsa = RSA_new();
  this->rsa = (RSA *)rsa;
  if (rsa != (RSA *)0x0) {
    meth = (RSA_METHOD *)RSA_PKCS1_OpenSSL();
    RSA_set_method(rsa,meth);
    pBVar1 = OSSL::byteString2bn(&(this->super_RSAPublicKey).n);
    pBVar2 = OSSL::byteString2bn(&(this->super_RSAPublicKey).e);
    RSA_set0_key(this->rsa,pBVar1,pBVar2,0);
    return;
  }
  softHSMLog(3,"createOSSLKey",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSAPublicKey.cpp"
             ,0x83,"Could not create RSA object");
  return;
}

Assistant:

void OSSLRSAPublicKey::createOSSLKey()
{
	if (rsa != NULL) return;

	rsa = RSA_new();
	if (rsa == NULL)
	{
		ERROR_MSG("Could not create RSA object");
		return;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		RSA_set_method(rsa, FIPS_rsa_pkcs1_ssleay());
	else
		RSA_set_method(rsa, RSA_PKCS1_SSLeay());
#else
	RSA_set_method(rsa, RSA_PKCS1_SSLeay());
#endif

#else
	RSA_set_method(rsa, RSA_PKCS1_OpenSSL());
#endif

	BIGNUM* bn_n = OSSL::byteString2bn(n);
	BIGNUM* bn_e = OSSL::byteString2bn(e);

	RSA_set0_key(rsa, bn_n, bn_e, NULL);
}